

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  ostream *poVar4;
  service srv;
  thread fw_thread;
  forwarder fw;
  service asStack_58 [8];
  thread local_50;
  forwarder local_48;
  code *pcStack_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  cppcms::service::service(asStack_58,argc,argv);
  uVar2 = cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  cppcms::applications_pool::mount(uVar2,local_28,0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  pcVar3 = (char *)cppcms::service::settings();
  cppcms::json::value::find(pcVar3);
  iVar1 = cppcms::json::value::type();
  if (iVar1 == 4) {
    local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pcStack_30 = std::_Function_handler<void_(),_submitter>::_M_invoke;
    local_48.app_.p_ = (application *)std::_Function_handler<void_(),_submitter>::_M_manager;
    local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_ptr = asStack_58
    ;
    cppcms::service::after_fork((function *)asStack_58);
    if (local_48.app_.p_ != (application *)0x0) {
      (*(code *)local_48.app_.p_)(&local_48,&local_48,3);
    }
  }
  pcVar3 = (char *)cppcms::service::settings();
  cppcms::json::value::at(pcVar3);
  uVar2 = cppcms::json::value::boolean();
  forwarder::forwarder(&local_48,*(bool *)uVar2);
  std::thread::thread<forwarder&,,void>(&local_50,&local_48);
  cppcms::service::run();
  this._M_pi = local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  if (local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  cppcms::service::shutdown();
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  std::thread::join();
  if (local_50._M_id._M_thread == 0) {
    booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_48.app_);
    if (local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.srv.super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cppcms::service::~service(asStack_58);
    if ((run_ok == false) || (fw_ok != true)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed run=",0xb);
      poVar4 = std::ostream::_M_insert<bool>(true);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," forwarder=",0xb);
      poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar1 = 1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done Ok",7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      iVar1 = 0;
    }
    return iVar1;
  }
  std::terminate();
}

Assistant:

int main(int argc,char **argv) 
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		if(srv.settings().find("test.exec").type()==cppcms::json::is_string)
			srv.after_fork(submitter(srv));
	
		bool internal=srv.settings().get<bool>("test.internal");	
		forwarder fw(internal);
		booster::thread fw_thread(fw);
		
		srv.run();
		fw.service()->shutdown();
		fw_thread.join();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	if(run_ok  && fw_ok) {
		std::cout << "Done Ok" << std::endl;
		return EXIT_SUCCESS;
	}
	else {
		std::cerr << "Failed run=" << run_ok << " forwarder=" << fw_ok << std::endl;
		return EXIT_FAILURE;
	}
}